

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CustomPrinterForMessageContent_Test::TestBody
          (TextFormatTest_CustomPrinterForMessageContent_Test *this)

{
  bool bVar1;
  ImportMessage *pIVar2;
  FastFieldValuePrinter *printer_00;
  char *message_00;
  AssertHelper local_418;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar;
  string text;
  CustomMessageContentFieldValuePrinter my_field_printer;
  Printer printer;
  undefined1 local_350 [8];
  TestAllTypes message;
  TextFormatTest_CustomPrinterForMessageContent_Test *this_local;
  
  message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350);
  proto2_unittest::TestAllTypes::mutable_optional_nested_message((TestAllTypes *)local_350);
  pIVar2 = proto2_unittest::TestAllTypes::mutable_optional_import_message((TestAllTypes *)local_350)
  ;
  proto2_unittest_import::ImportMessage::set_d(pIVar2,0x2a);
  proto2_unittest::TestAllTypes::add_repeated_nested_message((TestAllTypes *)local_350);
  proto2_unittest::TestAllTypes::add_repeated_nested_message((TestAllTypes *)local_350);
  pIVar2 = proto2_unittest::TestAllTypes::add_repeated_import_message((TestAllTypes *)local_350);
  proto2_unittest_import::ImportMessage::set_d(pIVar2,0x2b);
  pIVar2 = proto2_unittest::TestAllTypes::add_repeated_import_message((TestAllTypes *)local_350);
  proto2_unittest_import::ImportMessage::set_d(pIVar2,0x2c);
  TextFormat::Printer::Printer((Printer *)&my_field_printer);
  CustomMessageContentFieldValuePrinter::CustomMessageContentFieldValuePrinter
            ((CustomMessageContentFieldValuePrinter *)((long)&text.field_2 + 8));
  printer_00 = (FastFieldValuePrinter *)operator_new(8);
  printer_00->_vptr_FastFieldValuePrinter = (_func_int **)0x0;
  CustomMessageContentFieldValuePrinter::CustomMessageContentFieldValuePrinter
            ((CustomMessageContentFieldValuePrinter *)printer_00);
  TextFormat::Printer::SetDefaultFieldValuePrinter((Printer *)&my_field_printer,printer_00);
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  TextFormat::Printer::PrintToString
            ((Printer *)&my_field_printer,(Message *)local_350,(string *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[235],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_408,
             "\"optional_nested_message {\\n\" \"}\\n\" \"optional_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\" \"repeated_nested_message {\\n\" \"}\\n\" \"repeated_nested_message {\\n\" \"}\\n\" \"repeated_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\" \"repeated_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\""
             ,"text",(char (*) [235])
                     "optional_nested_message {\n}\noptional_import_message {\n  # REDACTED, 2 bytes\n}\nrepeated_nested_message {\n}\nrepeated_nested_message {\n}\nrepeated_import_message {\n  # REDACTED, 2 bytes\n}\nrepeated_import_message {\n  # REDACTED, 2 bytes\n}\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,800,message_00);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  CustomMessageContentFieldValuePrinter::~CustomMessageContentFieldValuePrinter
            ((CustomMessageContentFieldValuePrinter *)((long)&text.field_2 + 8));
  TextFormat::Printer::~Printer((Printer *)&my_field_printer);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST_F(TextFormatTest, CustomPrinterForMessageContent) {
  proto2_unittest::TestAllTypes message;
  message.mutable_optional_nested_message();
  message.mutable_optional_import_message()->set_d(42);
  message.add_repeated_nested_message();
  message.add_repeated_nested_message();
  message.add_repeated_import_message()->set_d(43);
  message.add_repeated_import_message()->set_d(44);
  TextFormat::Printer printer;
  CustomMessageContentFieldValuePrinter my_field_printer;
  printer.SetDefaultFieldValuePrinter(
      new CustomMessageContentFieldValuePrinter());
  std::string text;
  printer.PrintToString(message, &text);
  EXPECT_EQ(
      "optional_nested_message {\n"
      "}\n"
      "optional_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n"
      "repeated_nested_message {\n"
      "}\n"
      "repeated_nested_message {\n"
      "}\n"
      "repeated_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n"
      "repeated_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n",
      text);
}